

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

aigPoIndices * allocAigPoIndices(void)

{
  aigPoIndices *paVar1;
  aigPoIndices *newAigPoIndices;
  
  paVar1 = (aigPoIndices *)malloc(0x10);
  paVar1->attrPendingSignalIndex = -1;
  paVar1->attrHintSingalBeginningMarker = -1;
  paVar1->attrHintSingalEndMarker = -1;
  paVar1->attrSafetyInvarIndex = -1;
  if (paVar1 != (aigPoIndices *)0x0) {
    return paVar1;
  }
  __assert_fail("newAigPoIndices != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/monotone.c"
                ,0x35,"struct aigPoIndices *allocAigPoIndices()");
}

Assistant:

struct aigPoIndices *allocAigPoIndices()
{
    struct aigPoIndices *newAigPoIndices;

    newAigPoIndices = (struct aigPoIndices *)malloc(sizeof (struct aigPoIndices));
    newAigPoIndices->attrPendingSignalIndex = -1;
    newAigPoIndices->attrHintSingalBeginningMarker = -1;
    newAigPoIndices->attrHintSingalEndMarker = -1;
    newAigPoIndices->attrSafetyInvarIndex = -1;

    assert( newAigPoIndices != NULL );
    return newAigPoIndices;
}